

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O2

bool __thiscall Minisat::StringOption::parse(StringOption *this,char *str)

{
  bool bVar1;
  string *this_00;
  allocator local_39;
  char *span;
  string local_30 [32];
  
  span = str;
  bVar1 = match<char_const*>(&span,"-");
  if (((bVar1) && (bVar1 = match<char_const*>(&span,(this->super_Option).name), bVar1)) &&
     (bVar1 = match<char_const*>(&span,"="), bVar1)) {
    if (this->value == (string *)0x0) {
      this_00 = (string *)operator_new(0x20);
      std::__cxx11::string::string((string *)this_00,span,(allocator *)local_30);
      this->value = this_00;
    }
    else {
      std::__cxx11::string::string(local_30,span,&local_39);
      std::__cxx11::string::operator=((string *)this->value,local_30);
      std::__cxx11::string::~string(local_30);
    }
    return true;
  }
  return false;
}

Assistant:

virtual bool parse(const char *str)
    {
        const char *span = str;

        if (!match(span, "-") || !match(span, name) || !match(span, "=")) return false;

        if (value == NULL) {
            value = new std::string(span);
        } else {
            *value = std::string(span);
        }
        return true;
    }